

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetSegmentLocalRotationHelical
          (VClient *this,string *i_rSubjectName,string *i_rSegmentName,double (*o_rThreeVector) [3],
          bool *o_rbOccluded)

{
  Enum EVar1;
  scoped_lock Lock;
  double RotationArray [9];
  unique_lock<boost::recursive_mutex> uStack_88;
  double local_78 [9];
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&uStack_88,&this->m_FrameMutex);
  ClientUtils::Clear<double,3u>(o_rThreeVector);
  ClientUtils::Clear(o_rbOccluded);
  EVar1 = GetSegmentLocalRotationMatrix(this,i_rSubjectName,i_rSegmentName,&local_78,o_rbOccluded);
  if ((EVar1 == Success) && (*o_rbOccluded == false)) {
    ClientUtils::MatrixToHelical(local_78,o_rThreeVector);
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&uStack_88);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetSegmentLocalRotationHelical( const std::string & i_rSubjectName, 
                                                      const std::string & i_rSegmentName, 
                                                            double    ( & o_rThreeVector)[3], 
                                                            bool        & o_rbOccluded ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Clear( o_rThreeVector );
  Clear( o_rbOccluded );

  // Get the answer as a rotation matrix
  double RotationArray[ 9 ];
  const Result::Enum _Result = GetSegmentLocalRotationMatrix( i_rSubjectName, i_rSegmentName, RotationArray, o_rbOccluded );

  if( Result::Success == _Result && !o_rbOccluded )
  {
    MatrixToHelical( RotationArray, o_rThreeVector );
  }

  return _Result;
}